

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_tests.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  SingletonDatabase *pSVar2;
  long *plVar3;
  long *local_38 [2];
  long local_28 [2];
  
  pSVar2 = SingletonDatabase::get();
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Tokyo","");
  iVar1 = (**(pSVar2->super_IDatabase)._vptr_IDatabase)(pSVar2,local_38);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
	//auto* nsd{NaiveSingletonDatabase::get_instance()};
	//NaiveSingletonDatabase::destroy_instance();

	auto& sd{SingletonDatabase::get()};
	std::cout << sd.get_population("Tokyo") << std::endl;

	return 0;
}